

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_aux_mesh.cxx
# Opt level: O0

void __thiscall
level_aux_mesh::compact_vertices<xray_re::hom_poly>
          (level_aux_mesh *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *refs,
          hom_poly *faces)

{
  uint32_t uVar1;
  bool bVar2;
  iterator __first;
  iterator __last;
  size_type sVar3;
  reference puVar4;
  uint32_t *puVar5;
  fvector3 *pfVar6;
  _vector3<float> *__x;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *__lhs;
  bool local_7d;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_58;
  iterator end;
  iterator it;
  uint32_t point_idx;
  fvector3 p;
  hom_poly *faces_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *refs_local;
  level_aux_mesh *this_local;
  
  __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(refs);
  __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(refs);
  vertex_less<xray_re::hom_poly>::vertex_less
            ((vertex_less<xray_re::hom_poly> *)((long)&p.field_0 + 4),faces);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,vertex_less<xray_re::hom_poly>>
            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__last._M_current,(vertex_less<xray_re::hom_poly>)p.field_0._4_8_);
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(refs);
  std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::reserve
            (&(this->super_xr_mesh_builder).super_xr_mesh.m_points,sVar3);
  sVar3 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::size
                    (&(this->super_xr_mesh_builder).super_xr_mesh.m_points);
  it._M_current._0_4_ = (uint32_t)sVar3;
  end = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(refs);
  local_58._M_current = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(refs);
  while (bVar2 = __gnu_cxx::operator!=(&end,&local_58), uVar1 = (uint32_t)it._M_current, bVar2) {
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&end);
    puVar5 = vertex_point(this,(ulong)*puVar4);
    *puVar5 = uVar1;
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&end);
    pfVar6 = face_vertex<xray_re::hom_poly>(faces,*puVar4);
    __x = xray_re::_vector3<float>::set<float>((_vector3<float> *)((long)&it._M_current + 4),pfVar6)
    ;
    std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::push_back
              (&(this->super_xr_mesh_builder).super_xr_mesh.m_points,__x);
    while( true ) {
      __lhs = __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator++(&end);
      bVar2 = __gnu_cxx::operator!=(__lhs,&local_58);
      local_7d = false;
      if (bVar2) {
        puVar4 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&end);
        pfVar6 = face_vertex<xray_re::hom_poly>(faces,*puVar4);
        local_7d = xray_re::_vector3<float>::operator==
                             (pfVar6,(_vector3<float> *)((long)&it._M_current + 4));
      }
      uVar1 = (uint32_t)it._M_current;
      if (local_7d == false) break;
      puVar4 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&end);
      puVar5 = vertex_point(this,(ulong)*puVar4);
      *puVar5 = uVar1;
    }
    it._M_current._0_4_ = (uint32_t)it._M_current + 1;
  }
  return;
}

Assistant:

void level_aux_mesh::compact_vertices(std::vector<uint32_t>& refs, const T* faces)
{
	std::sort(refs.begin(), refs.end(), vertex_less<T>(faces));
	m_points.reserve(refs.size());
	fvector3 p;
	uint32_t point_idx = uint32_t(m_points.size() & UINT32_MAX);
	for (std::vector<uint32_t>::iterator it = refs.begin(), end = refs.end(); it != end; ++point_idx) {
		vertex_point(*it) = point_idx;
		m_points.push_back(p.set(face_vertex<T>(faces, *it)));
		while(++it != end && face_vertex<T>(faces, *it) == p)
			vertex_point(*it) = point_idx;
	}
}